

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O3

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  float *pfVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float *ptr;
  uint uVar10;
  int iVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  iVar7 = bottom_top_blob->elempack;
  iVar11 = bottom_top_blob->dims;
  iVar3 = bottom_top_blob->w;
  uVar9 = bottom_top_blob->h;
  if (iVar11 == 3) {
    uVar8 = bottom_top_blob->c;
    if (0 < (int)uVar8) {
      uVar9 = iVar3 * iVar7 * uVar9;
      pp_Var4 = this->_vptr_PReLU_x86;
      uVar13 = 0;
      do {
        pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var4[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
          fVar17 = *pfVar6;
          fVar19 = fVar17;
          fVar20 = fVar17;
          fVar21 = fVar17;
          fVar22 = fVar17;
        }
        else {
          fVar17 = pfVar6[uVar13];
          fVar19 = fVar17;
          fVar20 = fVar17;
          fVar21 = fVar17;
          fVar22 = fVar17;
          if (iVar7 == 4) {
            pfVar6 = pfVar6 + uVar13 * 4;
            fVar19 = *pfVar6;
            fVar20 = pfVar6[1];
            fVar21 = pfVar6[2];
            fVar22 = pfVar6[3];
          }
        }
        pauVar15 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar9) {
          iVar11 = 3;
          do {
            auVar18 = maxps(*pauVar15,ZEXT816(0));
            auVar16 = minps(*pauVar15,ZEXT816(0));
            *(float *)*pauVar15 = auVar16._0_4_ * fVar19 + auVar18._0_4_;
            *(float *)(*pauVar15 + 4) = auVar16._4_4_ * fVar20 + auVar18._4_4_;
            *(float *)(*pauVar15 + 8) = auVar16._8_4_ * fVar21 + auVar18._8_4_;
            *(float *)(*pauVar15 + 0xc) = auVar16._12_4_ * fVar22 + auVar18._12_4_;
            pauVar15 = pauVar15 + 1;
            iVar11 = iVar11 + 4;
            uVar10 = uVar9 & 0xfffffffc;
          } while (iVar11 < (int)uVar9);
        }
        if (uVar9 - uVar10 != 0 && (int)uVar10 <= (int)uVar9) {
          lVar14 = 0;
          do {
            if (*(float *)(*pauVar15 + lVar14 * 4) < 0.0) {
              *(float *)(*pauVar15 + lVar14 * 4) = *(float *)(*pauVar15 + lVar14 * 4) * fVar17;
            }
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar10 != (int)lVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar8);
    }
  }
  else if (iVar11 == 2) {
    if (0 < (int)uVar9) {
      uVar8 = iVar3 * iVar7;
      pp_Var4 = this->_vptr_PReLU_x86;
      uVar13 = 0;
      do {
        pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var4[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
          fVar17 = *pfVar6;
          fVar19 = fVar17;
          fVar20 = fVar17;
          fVar21 = fVar17;
          fVar22 = fVar17;
        }
        else {
          fVar17 = pfVar6[uVar13];
          fVar19 = fVar17;
          fVar20 = fVar17;
          fVar21 = fVar17;
          fVar22 = fVar17;
          if (iVar7 == 4) {
            pfVar6 = pfVar6 + uVar13 * 4;
            fVar19 = *pfVar6;
            fVar20 = pfVar6[1];
            fVar21 = pfVar6[2];
            fVar22 = pfVar6[3];
          }
        }
        pauVar15 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar13 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar8) {
          iVar11 = 3;
          do {
            auVar18 = maxps(*pauVar15,ZEXT816(0));
            auVar16 = minps(*pauVar15,ZEXT816(0));
            *(float *)*pauVar15 = auVar16._0_4_ * fVar19 + auVar18._0_4_;
            *(float *)(*pauVar15 + 4) = auVar16._4_4_ * fVar20 + auVar18._4_4_;
            *(float *)(*pauVar15 + 8) = auVar16._8_4_ * fVar21 + auVar18._8_4_;
            *(float *)(*pauVar15 + 0xc) = auVar16._12_4_ * fVar22 + auVar18._12_4_;
            pauVar15 = pauVar15 + 1;
            iVar11 = iVar11 + 4;
            uVar10 = uVar8 & 0xfffffffc;
          } while (iVar11 < (int)uVar8);
        }
        if (uVar8 - uVar10 != 0 && (int)uVar10 <= (int)uVar8) {
          lVar14 = 0;
          do {
            if (*(float *)(*pauVar15 + lVar14 * 4) < 0.0) {
              *(float *)(*pauVar15 + lVar14 * 4) = *(float *)(*pauVar15 + lVar14 * 4) * fVar17;
            }
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar10 != (int)lVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar9);
    }
  }
  else if (iVar11 == 1) {
    iVar7 = iVar7 * iVar3;
    pp_Var4 = this->_vptr_PReLU_x86;
    p_Var5 = pp_Var4[-3];
    pauVar15 = (undefined1 (*) [16])bottom_top_blob->data;
    pfVar6 = *(float **)(&this->field_0xd8 + (long)p_Var5);
    if (*(int *)(&this->field_0xd0 + (long)p_Var5) < 2) {
      fVar17 = *pfVar6;
      iVar11 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar11 = iVar7;
      }
      if (3 < iVar7) {
        uVar13 = (ulong)(uint)(iVar11 >> 2);
        pauVar12 = pauVar15;
        do {
          auVar18 = maxps(*pauVar12,ZEXT816(0));
          auVar16 = minps(*pauVar12,ZEXT816(0));
          *(float *)*pauVar12 = auVar16._0_4_ * fVar17 + auVar18._0_4_;
          *(float *)(*pauVar12 + 4) = auVar16._4_4_ * fVar17 + auVar18._4_4_;
          *(float *)(*pauVar12 + 8) = auVar16._8_4_ * fVar17 + auVar18._8_4_;
          *(float *)(*pauVar12 + 0xc) = auVar16._12_4_ * fVar17 + auVar18._12_4_;
          pauVar12 = pauVar12 + 1;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      iVar11 = (iVar11 >> 2) << 2;
      if (iVar11 < iVar7) {
        lVar14 = (long)iVar11;
        do {
          if (*(float *)(*pauVar15 + lVar14 * 4) < 0.0) {
            *(float *)(*pauVar15 + lVar14 * 4) = *(float *)(*pauVar15 + lVar14 * 4) * fVar17;
          }
          lVar14 = lVar14 + 1;
        } while (iVar7 != lVar14);
      }
    }
    else {
      iVar11 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar11 = iVar7;
      }
      if (3 < iVar7) {
        uVar13 = (ulong)(uint)(iVar11 >> 2);
        lVar14 = 0;
        do {
          auVar18 = maxps(*(undefined1 (*) [16])(*pauVar15 + lVar14),ZEXT816(0));
          auVar16 = minps(*(undefined1 (*) [16])(*pauVar15 + lVar14),ZEXT816(0));
          pfVar1 = (float *)((long)pfVar6 + lVar14);
          fVar17 = pfVar1[1];
          fVar19 = pfVar1[2];
          fVar20 = pfVar1[3];
          pfVar2 = (float *)(*pauVar15 + lVar14);
          *pfVar2 = auVar16._0_4_ * *pfVar1 + auVar18._0_4_;
          pfVar2[1] = auVar16._4_4_ * fVar17 + auVar18._4_4_;
          pfVar2[2] = auVar16._8_4_ * fVar19 + auVar18._8_4_;
          pfVar2[3] = auVar16._12_4_ * fVar20 + auVar18._12_4_;
          lVar14 = lVar14 + 0x10;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      iVar11 = (iVar11 >> 2) << 2;
      if (iVar11 < iVar7) {
        lVar14 = (long)iVar11;
        do {
          if (*(float *)(*pauVar15 + lVar14 * 4) < 0.0) {
            *(float *)(*pauVar15 + lVar14 * 4) =
                 *(float *)(*pauVar15 + lVar14 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar14 * 4);
          }
          lVar14 = lVar14 + 1;
        } while (iVar7 != lVar14);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}